

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

NonMaximumSuppressionLayerParams * __thiscall
CoreML::Specification::NonMaximumSuppressionLayerParams::New
          (NonMaximumSuppressionLayerParams *this,Arena *arena)

{
  NonMaximumSuppressionLayerParams *this_00;
  
  this_00 = (NonMaximumSuppressionLayerParams *)operator_new(0x28);
  NonMaximumSuppressionLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::NonMaximumSuppressionLayerParams>
              (arena,this_00);
  }
  return this_00;
}

Assistant:

NonMaximumSuppressionLayerParams* NonMaximumSuppressionLayerParams::New(::google::protobuf::Arena* arena) const {
  NonMaximumSuppressionLayerParams* n = new NonMaximumSuppressionLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}